

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

void Bmc_GiaGenerateJust(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvValues,Vec_Bit_t **pvJustis)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Bit_t *vValues;
  Vec_Bit_t *p_00;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int extraout_EDX;
  int Entry;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong local_60;
  
  vValues = Vec_BitStart((pCex->iFrame + 1) * p->nObjs);
  p_00 = Vec_BitStart((pCex->iFrame + 1) * p->nObjs);
  Gia_ManCleanMark0(p);
  Gia_ManCleanMark1(p);
  local_60 = 0;
  while( true ) {
    iVar4 = (int)local_60;
    if ((p->nRegs <= iVar4) ||
       (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar4), pGVar5 == (Gia_Obj_t *)0x0))
    break;
    *(ulong *)pGVar5 =
         *(ulong *)pGVar5 & 0xffffffffbfffffff |
         (ulong)(((uint)(&pCex[1].iPo)[local_60 >> 5] >> ((byte)local_60 & 0x1f) & 1) << 0x1e);
    local_60 = (ulong)(iVar4 + 1);
  }
  iVar7 = 0;
  iVar4 = 0;
  do {
    if (pCex->iFrame < iVar7) {
      if ((int)local_60 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0xa5,
                      "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                     );
      }
      Gia_ManCleanMark0(p);
      Gia_ManCleanMark1(p);
      pGVar5 = Gia_ManPo(p,pCex->iPo);
      iVar4 = pCex->iFrame;
      iVar7 = p->nObjs;
      iVar15 = Gia_ObjId(p,pGVar5);
      iVar4 = Vec_BitEntry(p_00,iVar4 * iVar7 + iVar15);
      if (iVar4 != 0) {
        __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0xaa,
                      "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                     );
      }
      iVar4 = pCex->iFrame;
      iVar7 = p->nObjs;
      iVar15 = Gia_ObjId(p,pGVar5);
      Vec_BitWriteEntry(p_00,iVar4 * iVar7 + iVar15,Entry);
      Bmc_GiaGenerateJustNonRec(p,pCex->iFrame,vValues,p_00);
      iVar4 = pCex->iFrame;
      iVar7 = p->nObjs;
      iVar15 = Gia_ObjId(p,pGVar5);
      iVar4 = Vec_BitEntry(p_00,iVar4 * iVar7 + iVar15);
      if (iVar4 == 0) {
        __assert_fail("Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                      ,0xae,
                      "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                     );
      }
      *pvValues = vValues;
      *pvJustis = p_00;
      return;
    }
    for (iVar15 = 0; iVar3 = p->nObjs, iVar15 < iVar3; iVar15 = iVar15 + 1) {
      pGVar5 = Gia_ManObj(p,iVar15);
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        iVar3 = p->nObjs;
        break;
      }
      uVar9 = *(ulong *)pGVar5;
      uVar2 = (uint)uVar9;
      uVar8 = uVar9 & 0x1fffffff;
      if (uVar8 == 0x1fffffff || (int)uVar2 < 0) {
        if ((~uVar2 & 0x9fffffff) == 0) {
          iVar3 = Gia_ObjIsPi(p,pGVar5);
          if (iVar3 == 0) {
            pGVar6 = Gia_ObjRoToRi(p,pGVar5);
            *(ulong *)pGVar5 =
                 *(ulong *)pGVar5 & 0xffffffffbfffffff |
                 (ulong)((uint)*(undefined8 *)pGVar6 & 0x40000000);
            pGVar6 = Gia_ObjRoToRi(p,pGVar5);
            uVar11 = 0xbfffffffffffffff;
            uVar9 = *(ulong *)pGVar5 & 0xbfffffffffffffff | *(ulong *)pGVar6 & 0x4000000000000000;
          }
          else {
            uVar11 = (ulong)(((uint)(&pCex[1].iPo)[(int)local_60 >> 5] >> ((byte)local_60 & 0x1f) &
                             1) << 0x1e);
            uVar9 = *(ulong *)pGVar5 & 0xbfffffffbfffffff | 0x4000000000000000 | uVar11;
            local_60 = (ulong)((int)local_60 + 1);
          }
        }
        else if ((int)uVar2 < 0 && (int)uVar8 != 0x1fffffff) {
          uVar10 = (ulong)((uVar2 * 2 ^ *(uint *)(pGVar5 + -uVar8)) & 0x40000000);
          *(ulong *)pGVar5 = uVar9 & 0xffffffffbfffffff | uVar10;
          uVar11 = 0xbfffffffffffffff;
          uVar9 = uVar9 & 0xbfffffffbfffffff | uVar10 |
                  *(ulong *)(pGVar5 + -uVar8) & 0x4000000000000000;
        }
        else {
          uVar11 = 0x1fffffff1fffffff;
          if ((~uVar9 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                          ,0x9e,
                          "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                         );
          }
          uVar9 = uVar9 | 0x4000000000000000;
        }
      }
      else {
        uVar11 = *(ulong *)(pGVar5 + -uVar8);
        uVar12 = (uint)(uVar9 >> 0x1d) & 7 ^ (uint)(uVar11 >> 0x1e) & 3;
        uVar2 = (uint)(uVar9 >> 0x20);
        uVar8 = *(ulong *)(pGVar5 + -(ulong)(uVar2 & 0x1fffffff));
        uVar16 = (uint)(uVar8 >> 0x1e) & 1;
        uVar14 = uVar2 >> 0x1d & 1;
        uVar13 = (uVar16 ^ uVar14) & uVar12;
        uVar10 = (ulong)(uVar13 << 0x1e);
        *(ulong *)pGVar5 = uVar9 & 0xffffffff3fffffff | uVar10;
        uVar2 = (uint)(uVar8 >> 0x20);
        uVar1 = (uint)(uVar11 >> 0x20);
        if (uVar13 == 0) {
          if (((uVar12 & 1) == 0) && (uVar16 == uVar14)) {
            uVar9 = uVar9 & 0xbfffffff3fffffff | ((ulong)((uVar2 | uVar1) >> 0x1e) & 1) << 0x3e;
          }
          else if ((uVar12 & 1) == 0) {
            uVar11 = uVar11 & 0x4000000000000000;
            uVar9 = uVar9 & 0xbfffffff3fffffff | uVar11;
          }
          else {
            if (uVar16 != uVar14) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                            ,0x88,
                            "void Bmc_GiaGenerateJust(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, Vec_Bit_t **)"
                           );
            }
            uVar9 = uVar9 & 0xbfffffff3fffffff | uVar8 & 0x4000000000000000;
          }
        }
        else {
          uVar9 = uVar9 & 0xbfffffff3fffffff | uVar10 | (ulong)((uVar2 & uVar1) >> 0x1e & 1) << 0x3e
          ;
        }
      }
      iVar3 = (int)uVar11;
      *(ulong *)pGVar5 = uVar9;
      if (((uint)uVar9 >> 0x1e & 1) != 0) {
        Vec_BitWriteEntry(vValues,iVar4 + iVar15,iVar3);
        uVar9 = *(ulong *)pGVar5;
        iVar3 = extraout_EDX;
      }
      if ((uVar9 & 0x4000000000000000) != 0) {
        Vec_BitWriteEntry(p_00,iVar4 + iVar15,iVar3);
      }
    }
    iVar7 = iVar7 + 1;
    iVar4 = iVar3 + iVar4;
  } while( true );
}

Assistant:

void Bmc_GiaGenerateJust( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvValues, Vec_Bit_t ** pvJustis )
{
    Vec_Bit_t * vValues = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Vec_Bit_t * vJustis = Vec_BitStart( Gia_ManObjNum(p) * (pCex->iFrame + 1) );
    Gia_Obj_t * pObj;
    int i, k, iBit = 0, fCompl0, fCompl1, fJusti0, fJusti1, Shift;

    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    Gia_ManForEachRi( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    for ( Shift = i = 0; i <= pCex->iFrame; i++, Shift += Gia_ManObjNum(p) )
    {
        Gia_ManForEachObj( p, pObj, k )
        {
            if ( Gia_ObjIsAnd(pObj) )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                fJusti0 = Gia_ObjFanin0(pObj)->fMark1;
                fJusti1 = Gia_ObjFanin1(pObj)->fMark1;
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->fMark1 = fJusti0 & fJusti1;
                else if ( !fCompl0 && !fCompl1 )
                    pObj->fMark1 = fJusti0 | fJusti1;
                else if ( !fCompl0 )
                    pObj->fMark1 = fJusti0;
                else if ( !fCompl1 )
                    pObj->fMark1 = fJusti1;
                else assert( 0 );
            }
            else if ( Gia_ObjIsCi(pObj) )
            {
                if ( Gia_ObjIsPi(p, pObj) )
                {
                    pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
                    pObj->fMark1 = 1;
                }
                else
                {
                    pObj->fMark0 = Gia_ObjRoToRi(p, pObj)->fMark0;
                    pObj->fMark1 = Gia_ObjRoToRi(p, pObj)->fMark1;
                }
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            }
            else if ( Gia_ObjIsConst0(pObj) )
                pObj->fMark1 = 1;
            else assert( 0 );
            if ( pObj->fMark0 )
                Vec_BitWriteEntry( vValues, Shift + k, 1 );
            if ( pObj->fMark1 )
                Vec_BitWriteEntry( vJustis, Shift + k, 1 );
        }
    }
    assert( iBit == pCex->nBits );
    Gia_ManCleanMark0(p);
    Gia_ManCleanMark1(p);
    // perform backward traversal to mark just nodes
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 0 );
//    Bmc_GiaGenerateJust_rec( p, pCex->iFrame, Gia_ObjId(p, pObj), vValues, vJustis );
    Vec_BitWriteEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj), 1);
    Bmc_GiaGenerateJustNonRec( p, pCex->iFrame, vValues, vJustis );
    assert( Vec_BitEntry(vJustis, Gia_ManObjNum(p) * pCex->iFrame + Gia_ObjId(p, pObj)) == 1 );

    // return the result
    *pvValues = vValues;
    *pvJustis = vJustis;
}